

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hpp
# Opt level: O1

ostream * bal::operator<<(ostream *stream,literal_t *value)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  
  uVar1 = value->id_;
  if (uVar1 - 2 < 0xfffffffd) {
    if ((uVar1 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"-",1);
    }
    *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
         *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)stream);
  }
  else {
    if (uVar1 == 0xffffffff) {
      pcVar3 = "*";
      lVar2 = 1;
    }
    else {
      pcVar3 = "0b0";
      if (uVar1 == 1) {
        pcVar3 = "0b1";
      }
      lVar2 = 3;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,lVar2);
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const literal_t& value) {
            if (value.is_variable()) {
                if (value.is_negation()) {
                    stream << "-";
                };
                stream << std::dec << (value.variable_id() + 1);
            } else if (value.is_unassigned()) {
                stream << "*";
            } else {
                stream << (value.is_constant_1() ? "0b1" : "0b0");
            };
            return stream;
        }